

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void fixjump(FuncState *fs,int pc,int dest)

{
  uint uVar1;
  uint uVar2;
  
  if (dest == -1) {
    __assert_fail("dest != (-1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                  ,0x71,"void fixjump(FuncState *, int, int)");
  }
  uVar1 = ~pc + dest;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  if (uVar2 < 0x8001) {
    *(ushort *)((long)fs->f->code + (long)pc * 4 + 2) = (ushort)uVar1 ^ 0x8000;
    return;
  }
  luaX_syntaxerror(fs->ls,"control structure too long");
}

Assistant:

static void fixjump (FuncState *fs, int pc, int dest) {
  Instruction *jmp = &fs->f->code[pc];
  int offset = dest - (pc + 1);
  lua_assert(dest != NO_JUMP);
  if (abs(offset) > MAXARG_sBx)
    luaX_syntaxerror(fs->ls, "control structure too long");
  SETARG_sBx(*jmp, offset);
}